

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cc
# Opt level: O1

string * __thiscall
kratos::SystemVerilogCodeGen::get_var_width_str_abi_cxx11_
          (string *__return_storage_ptr__,SystemVerilogCodeGen *this,Var *var)

{
  long *plVar1;
  bool bVar2;
  char cVar3;
  char cVar4;
  int iVar5;
  uint uVar6;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  uint __val;
  string_view format_str;
  string_view format_str_00;
  format_args args;
  format_args args_00;
  long *local_a8;
  undefined8 uStack_a0;
  long *local_98;
  undefined8 uStack_90;
  long local_88 [2];
  undefined1 auStack_78 [8];
  string __str;
  size_type *psStack_50;
  string width;
  
  psStack_50 = &width._M_string_length;
  width._M_dataplus._M_p = (pointer)0x0;
  width._M_string_length._0_1_ = 0;
  plVar1 = *(long **)&(this->stream_).super_stringstream.field_0x100;
  if (plVar1 == (long *)0x0) {
    __val = *(int *)&(this->options_).package_name._M_dataplus._M_p - 1;
    cVar4 = '\x01';
    if (9 < __val) {
      uVar6 = __val;
      cVar3 = '\x04';
      do {
        cVar4 = cVar3;
        if (uVar6 < 100) {
          cVar4 = cVar4 + -2;
          goto LAB_00198fa4;
        }
        if (uVar6 < 1000) {
          cVar4 = cVar4 + -1;
          goto LAB_00198fa4;
        }
        if (uVar6 < 10000) goto LAB_00198fa4;
        bVar2 = 99999 < uVar6;
        uVar6 = uVar6 / 10000;
        cVar3 = cVar4 + '\x04';
      } while (bVar2);
      cVar4 = cVar4 + '\x01';
    }
LAB_00198fa4:
    auStack_78 = (undefined1  [8])&__str._M_string_length;
    std::__cxx11::string::_M_construct((ulong)auStack_78,cVar4);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)auStack_78,(uint)__str._M_dataplus._M_p,__val);
    std::__cxx11::string::operator=((string *)&psStack_50,(string *)auStack_78);
    if (auStack_78 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)auStack_78,__str._M_string_length + 1);
    }
  }
  else {
    (**(code **)(*plVar1 + 0xf8))(&local_98);
    local_a8 = local_98;
    uStack_a0 = uStack_90;
    format_str.size_ = 0xd;
    format_str.data_ = (char *)0x5;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)&local_a8;
    fmt::v7::detail::vformat_abi_cxx11_((string *)auStack_78,(detail *)"{0}-1",format_str,args);
    std::__cxx11::string::operator=((string *)&psStack_50,(string *)auStack_78);
    if (auStack_78 != (undefined1  [8])&__str._M_string_length) {
      operator_delete((void *)auStack_78,__str._M_string_length + 1);
    }
    if (local_98 != local_88) {
      operator_delete(local_98,local_88[0] + 1);
    }
  }
  if (((*(uint *)&(this->options_).package_name._M_dataplus._M_p < 2) ||
      (iVar5 = (*this->_vptr_SystemVerilogCodeGen[0x17])(this), (char)iVar5 != '\0')) &&
     (*(long *)&(this->stream_).super_stringstream.field_0x100 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    auStack_78 = (undefined1  [8])psStack_50;
    __str._M_dataplus = width._M_dataplus;
    format_str_00.size_ = 0xd;
    format_str_00.data_ = (char *)0x7;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .field_1.args_ = in_R9.args_;
    args_00.
    super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
    .desc_ = (unsigned_long_long)auStack_78;
    fmt::v7::detail::vformat_abi_cxx11_
              (__return_storage_ptr__,(detail *)"[{0}:0]",format_str_00,args_00);
  }
  if (psStack_50 != &width._M_string_length) {
    operator_delete(psStack_50,
                    CONCAT71(width._M_string_length._1_7_,(undefined1)width._M_string_length) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string SystemVerilogCodeGen::get_var_width_str(const Var* var) {
    std::string width;
    if (var->parametrized()) {
        width = ::format("{0}-1", var->width_param()->to_string());
    } else {
        width = std::to_string(var->var_width() - 1);
    }
    return (var->var_width() > 1 && !var->is_struct()) || var->parametrized()
               ? ::format("[{0}:0]", width)
               : "";
}